

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_dpb.c
# Opt level: O1

MPP_RET unmark_long_term_field_for_reference_by_frame_idx
                  (H264_DpbBuf_t *p_Dpb,RK_S32 structure,RK_S32 long_term_frame_idx,
                  RK_S32 mark_current,RK_U32 curr_frame_num,RK_S32 curr_pic_num)

{
  H264_FrameStore_t *pHVar1;
  H264_FrameStore_t *pHVar2;
  MPP_RET in_EAX;
  byte bVar3;
  
  if (curr_pic_num < 0) {
    in_EAX = p_Dpb->p_Vid->max_frame_num;
    curr_pic_num = curr_pic_num + in_EAX * 2;
  }
  if (p_Dpb->ltref_frames_in_buffer != 0) {
    bVar3 = 0;
    do {
      pHVar1 = p_Dpb->fs_ltref[bVar3];
      if (pHVar1->long_term_frame_idx == long_term_frame_idx) {
        if (structure == 2) {
          pHVar1 = p_Dpb->fs_ltref[bVar3];
          if ((pHVar1->is_long_term & 0xfffffffeU) == 2) {
LAB_00196517:
            unmark_for_long_term_reference(pHVar1);
          }
          else if (mark_current == 0) {
            if (pHVar1->frame_num != curr_pic_num >> 1) goto LAB_00196517;
          }
          else {
            pHVar2 = p_Dpb->last_picture;
            if (((pHVar2 == (H264_FrameStore_t *)0x0) || (pHVar2 != pHVar1)) ||
               (pHVar2->frame_num != curr_frame_num)) goto LAB_00196517;
          }
        }
        else if (structure == 1) {
          if ((pHVar1->is_long_term | 2U) == 3) {
LAB_001964f9:
            unmark_for_long_term_reference(pHVar1);
          }
          else if (mark_current == 0) {
            if (pHVar1->frame_num != curr_pic_num >> 1) goto LAB_001964f9;
          }
          else {
            pHVar2 = p_Dpb->last_picture;
            if (((pHVar2 == (H264_FrameStore_t *)0x0) || (pHVar2 != pHVar1)) ||
               (pHVar2->frame_num != curr_frame_num)) goto LAB_001964f9;
          }
        }
      }
      bVar3 = bVar3 + 1;
      in_EAX = (MPP_RET)bVar3;
    } while ((uint)bVar3 < p_Dpb->ltref_frames_in_buffer);
  }
  return in_EAX;
}

Assistant:

static MPP_RET unmark_long_term_field_for_reference_by_frame_idx(H264_DpbBuf_t *p_Dpb, RK_S32 structure,
                                                                 RK_S32 long_term_frame_idx, RK_S32 mark_current, RK_U32 curr_frame_num, RK_S32 curr_pic_num)
{
    RK_U8 i = 0;
    MPP_RET ret = MPP_ERR_UNKNOW;
    H264dVideoCtx_t *p_Vid = p_Dpb->p_Vid;

    VAL_CHECK(ret, structure != FRAME);
    if (curr_pic_num < 0)
        curr_pic_num += (2 * p_Vid->max_frame_num);

    for (i = 0; i < p_Dpb->ltref_frames_in_buffer; i++) {
        if (p_Dpb->fs_ltref[i]->long_term_frame_idx == long_term_frame_idx) {
            if (structure == TOP_FIELD) {
                if (p_Dpb->fs_ltref[i]->is_long_term == 3) {
                    unmark_for_long_term_reference(p_Dpb->fs_ltref[i]);
                } else {
                    if (p_Dpb->fs_ltref[i]->is_long_term == 1) {
                        unmark_for_long_term_reference(p_Dpb->fs_ltref[i]);
                    } else {
                        if (mark_current) {
                            if (p_Dpb->last_picture) {
                                if ((p_Dpb->last_picture != p_Dpb->fs_ltref[i]) || p_Dpb->last_picture->frame_num != curr_frame_num)
                                    unmark_for_long_term_reference(p_Dpb->fs_ltref[i]);
                            } else {
                                unmark_for_long_term_reference(p_Dpb->fs_ltref[i]);
                            }
                        } else {
                            if ((p_Dpb->fs_ltref[i]->frame_num) != (unsigned)(curr_pic_num >> 1)) {
                                unmark_for_long_term_reference(p_Dpb->fs_ltref[i]);
                            }
                        }
                    }
                }
            }
            if (structure == BOTTOM_FIELD) {
                if (p_Dpb->fs_ltref[i]->is_long_term == 3) {
                    unmark_for_long_term_reference(p_Dpb->fs_ltref[i]);
                } else {
                    if (p_Dpb->fs_ltref[i]->is_long_term == 2) {
                        unmark_for_long_term_reference(p_Dpb->fs_ltref[i]);
                    } else {
                        if (mark_current) {
                            if (p_Dpb->last_picture) {
                                if ((p_Dpb->last_picture != p_Dpb->fs_ltref[i]) || p_Dpb->last_picture->frame_num != curr_frame_num)
                                    unmark_for_long_term_reference(p_Dpb->fs_ltref[i]);
                            } else {
                                unmark_for_long_term_reference(p_Dpb->fs_ltref[i]);
                            }
                        } else {
                            if ((p_Dpb->fs_ltref[i]->frame_num) != (unsigned)(curr_pic_num >> 1)) {
                                unmark_for_long_term_reference(p_Dpb->fs_ltref[i]);
                            }
                        }
                    }
                }
            }
        }
    }
    return ret = MPP_OK;
__FAILED:
    return ret;
}